

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int32_t ucol_getUnsafeSet_63(UCollator *coll,USet *unsafe,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  USet *contractions;
  long lVar4;
  uint c;
  int iVar5;
  int itemIndex;
  UChar buffer [512];
  UChar local_438 [516];
  
  uset_clear_63(unsafe);
  uset_applyPattern_63(unsafe,L"[[:^tccc=0:][:^lccc=0:]]",0x18,1,status);
  uset_addRange_63(unsafe,0xd800,0xdfff);
  itemIndex = 0;
  contractions = uset_open_63(0,0);
  ucol_getContractionsAndExpansions_63(coll,contractions,(USet *)0x0,'\0',status);
  iVar1 = uset_size_63(contractions);
  if (0 < iVar1) {
    do {
      iVar2 = uset_getItem_63(contractions,itemIndex,(UChar32 *)0x0,(UChar32 *)0x0,local_438,0x200,
                              status);
      if (0 < iVar2) {
        iVar5 = 0;
        while( true ) {
          iVar3 = iVar5 + 1;
          c = (uint)(ushort)local_438[iVar5];
          if ((iVar3 != iVar2 && (c & 0xfc00) == 0xd800) &&
             (lVar4 = (long)iVar3, ((ushort)local_438[lVar4] & 0xfc00) == 0xdc00)) {
            iVar3 = iVar5 + 2;
            c = (uint)(ushort)local_438[iVar5] * 0x400 + (uint)(ushort)local_438[lVar4] + 0xfca02400
            ;
          }
          if (iVar2 <= iVar3) break;
          uset_add_63(unsafe,c);
          iVar5 = iVar3;
        }
      }
      itemIndex = itemIndex + 1;
    } while (itemIndex != iVar1);
  }
  uset_close_63(contractions);
  iVar1 = uset_size_63(unsafe);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getUnsafeSet( const UCollator *coll,
                  USet *unsafe,
                  UErrorCode *status)
{
    UChar buffer[internalBufferSize];
    int32_t len = 0;

    uset_clear(unsafe);

    // cccpattern = "[[:^tccc=0:][:^lccc=0:]]", unfortunately variant
    static const UChar cccpattern[25] = { 0x5b, 0x5b, 0x3a, 0x5e, 0x74, 0x63, 0x63, 0x63, 0x3d, 0x30, 0x3a, 0x5d,
                                    0x5b, 0x3a, 0x5e, 0x6c, 0x63, 0x63, 0x63, 0x3d, 0x30, 0x3a, 0x5d, 0x5d, 0x00 };

    // add chars that fail the fcd check
    uset_applyPattern(unsafe, cccpattern, 24, USET_IGNORE_SPACE, status);

    // add lead/trail surrogates
    // (trail surrogates should need to be unsafe only if the caller tests for UTF-16 code *units*,
    // not when testing code *points*)
    uset_addRange(unsafe, 0xd800, 0xdfff);

    USet *contractions = uset_open(0,0);

    int32_t i = 0, j = 0;
    ucol_getContractionsAndExpansions(coll, contractions, NULL, FALSE, status);
    int32_t contsSize = uset_size(contractions);
    UChar32 c = 0;
    // Contraction set consists only of strings
    // to get unsafe code points, we need to
    // break the strings apart and add them to the unsafe set
    for(i = 0; i < contsSize; i++) {
        len = uset_getItem(contractions, i, NULL, NULL, buffer, internalBufferSize, status);
        if(len > 0) {
            j = 0;
            while(j < len) {
                U16_NEXT(buffer, j, len, c);
                if(j < len) {
                    uset_add(unsafe, c);
                }
            }
        }
    }

    uset_close(contractions);

    return uset_size(unsafe);
}